

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIListBox::clear(CGUIListBox *this)

{
  core::array<irr::gui::CGUIListBox::ListItem>::clear(&this->Items);
  this->ItemsIconWidth = 0;
  this->Selected = -1;
  (*(this->ScrollBar->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2d])
            (this->ScrollBar,0);
  recalculateItemHeight(this);
  return;
}

Assistant:

void CGUIListBox::clear()
{
	Items.clear();
	ItemsIconWidth = 0;
	Selected = -1;

	ScrollBar->setPos(0);

	recalculateItemHeight();
}